

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O0

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
::ordering(SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
           *this,MatrixType *a,ConstCholMatrixPtr *pmat,CholMatrixType *ap)

{
  Type rows;
  Index IVar1;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  SparseMatrix<double,_0,_int> *in_RSI;
  SparseMatrix<double,_0,_int> *in_RDI;
  OrderingType ordering;
  CholMatrixType C;
  Index size;
  SparseSymmetricPermutationProduct<Eigen::SparseMatrix<double,_0,_int>,_1>
  *in_stack_ffffffffffffff28;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff40;
  SparseSymmetricPermutationProduct<Eigen::SparseMatrix<double,_0,_int>,_1> local_98;
  PermutationType *in_stack_ffffffffffffff80;
  Type mat;
  AMDOrdering<int> *in_stack_ffffffffffffff90;
  
  SparseMatrix<double,_0,_int>::rows(in_RSI);
  *in_RDX = in_RCX;
  SparseMatrix<double,_0,_int>::SparseMatrix(in_stack_ffffffffffffff40);
  rows = SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::selfadjointView<1u>
                   ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                    in_stack_ffffffffffffff28);
  mat = rows;
  SparseMatrix<double,0,int>::operator=
            (in_RDI,(EigenBase<Eigen::SparseSelfAdjointView<const_Eigen::SparseMatrix<double,_0,_int>,_1U>_>
                     *)in_stack_ffffffffffffff28);
  AMDOrdering<int>::operator()(in_stack_ffffffffffffff90,mat.m_matrix,in_stack_ffffffffffffff80);
  SparseMatrix<double,_0,_int>::~SparseMatrix(in_RDI);
  IVar1 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                    ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)0x1e05bd);
  if (IVar1 < 1) {
    PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::resize
              ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)in_RDI,
               (Index)in_stack_ffffffffffffff28);
  }
  else {
    PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::inverse
              ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)in_stack_ffffffffffffff28)
    ;
    in_stack_ffffffffffffff28 = &local_98;
    PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
              ((PermutationMatrix<_1,__1,_int> *)in_stack_ffffffffffffff90,
               (InverseImpl<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::PermutationStorage> *)
               mat.m_matrix);
    PermutationMatrix<-1,_-1,_int>::operator=
              ((PermutationMatrix<_1,__1,_int> *)in_RDI,
               (PermutationMatrix<_1,__1,_int> *)in_stack_ffffffffffffff28);
    PermutationMatrix<-1,_-1,_int>::~PermutationMatrix((PermutationMatrix<_1,__1,_int> *)0x1e0611);
  }
  SparseMatrix<double,_0,_int>::resize(in_stack_ffffffffffffff40,(Index)rows.m_matrix,(Index)in_RDI)
  ;
  SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::selfadjointView<1u>
            ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)in_stack_ffffffffffffff28);
  SparseSelfAdjointView<const_Eigen::SparseMatrix<double,_0,_int>,_1U>::twistedBy
            ((SparseSelfAdjointView<const_Eigen::SparseMatrix<double,_0,_int>,_1U> *)in_RDI,
             (PermutationMatrix<_1,__1,_int> *)in_stack_ffffffffffffff28);
  SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::selfadjointView<2u>
            ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)in_stack_ffffffffffffff28);
  SparseSelfAdjointView<Eigen::SparseMatrix<double,0,int>,2u>::operator=
            ((SparseSelfAdjointView<Eigen::SparseMatrix<double,_0,_int>,_2U> *)in_RDI,
             in_stack_ffffffffffffff28);
  return;
}

Assistant:

void SimplicialCholeskyBase<Derived>::ordering(const MatrixType& a, ConstCholMatrixPtr &pmat, CholMatrixType& ap)
{
  eigen_assert(a.rows()==a.cols());
  const Index size = a.rows();
  pmat = &ap;
  // Note that ordering methods compute the inverse permutation
  if(!internal::is_same<OrderingType,NaturalOrdering<Index> >::value)
  {
    {
      CholMatrixType C;
      C = a.template selfadjointView<UpLo>();
      
      OrderingType ordering;
      ordering(C,m_Pinv);
    }

    if(m_Pinv.size()>0) m_P = m_Pinv.inverse();
    else                m_P.resize(0);
    
    ap.resize(size,size);
    ap.template selfadjointView<Upper>() = a.template selfadjointView<UpLo>().twistedBy(m_P);
  }
  else
  {
    m_Pinv.resize(0);
    m_P.resize(0);
    if(int(UpLo)==int(Lower) || MatrixType::IsRowMajor)
    {
      // we have to transpose the lower part to to the upper one
      ap.resize(size,size);
      ap.template selfadjointView<Upper>() = a.template selfadjointView<UpLo>();
    }
    else
      internal::simplicial_cholesky_grab_input<CholMatrixType,MatrixType>::run(a, pmat, ap);
  }  
}